

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O0

void __thiscall
LinearScan::AvoidCompensationConflicts
          (LinearScan *this,LabelInstr *labelInstr,BranchInstr *branchInstr,
          Lifetime **labelRegContent,Lifetime **branchRegContent,Instr **pInsertionInstr,
          Instr **pInsertionStartInstr,bool needsAirlock,bool *pHasAirlock)

{
  Lifetime *pLVar1;
  bool bVar2;
  bool bVar3;
  Instr *pIVar4;
  RegOpnd *dstOpnd;
  RegOpnd *src2Opnd;
  byte local_aa;
  byte local_a9;
  RegNum regIter;
  RegNum labelReg;
  Lifetime *tmpLifetime;
  Instr *instrXchg;
  RegOpnd *reg2;
  RegOpnd *reg1;
  Lifetime *lifetime;
  Lifetime *labelLifetime;
  BitVector _unit;
  RegNum local_68 [4];
  BVIndex reg;
  RegNum conflictRegs [33];
  bool changed;
  bool needsAirlock_local;
  Instr **pInsertionInstr_local;
  Lifetime **branchRegContent_local;
  Lifetime **labelRegContent_local;
  BranchInstr *branchInstr_local;
  LabelInstr *labelInstr_local;
  LinearScan *this_local;
  
  bVar2 = true;
  do {
    if (!bVar2) {
      return;
    }
    memset(local_68,0,0x21);
    bVar2 = false;
    labelLifetime = (Lifetime *)(this->secondChanceRegs).word;
    _unit.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&labelLifetime);
    while (_unit.word._4_4_ != 0xffffffff) {
      BVUnitT<unsigned_long>::Clear((BVUnitT<unsigned_long> *)&labelLifetime,_unit.word._4_4_);
      pLVar1 = branchRegContent[_unit.word._4_4_];
      if (((pLVar1 != labelRegContent[_unit.word._4_4_]) &&
          (bVar3 = IRType_IsFloat(RegTypes[_unit.word._4_4_]), !bVar3)) &&
         (bVar3 = NeedsLoopBackEdgeCompensation(this,pLVar1,labelInstr), bVar3)) {
        pIVar4 = EnsureAirlock(this,needsAirlock,pHasAirlock,*pInsertionInstr,pInsertionStartInstr,
                               branchInstr,labelInstr);
        *pInsertionInstr = pIVar4;
        if (local_68[_unit.word._4_4_] != RegNOREG) {
          dstOpnd = IR::RegOpnd::New(branchRegContent[_unit.word._4_4_]->sym,
                                     (RegNum)_unit.word._4_4_,RegTypes[_unit.word._4_4_],this->func)
          ;
          src2Opnd = IR::RegOpnd::New(branchRegContent[_unit.word._4_4_]->sym,
                                      local_68[_unit.word._4_4_],RegTypes[_unit.word._4_4_],
                                      this->func);
          pIVar4 = IR::Instr::New(XCHG,&dstOpnd->super_Opnd,&dstOpnd->super_Opnd,
                                  &src2Opnd->super_Opnd,this->func);
          IR::Instr::InsertBefore(*pInsertionInstr,pIVar4);
          IR::Instr::CopyNumber(pIVar4,*pInsertionInstr);
          pLVar1 = branchRegContent[_unit.word._4_4_];
          branchRegContent[_unit.word._4_4_] = branchRegContent[local_68[_unit.word._4_4_]];
          branchRegContent[local_68[_unit.word._4_4_]] = pLVar1;
          _unit.word._4_4_ = (uint)local_68[_unit.word._4_4_];
          bVar2 = true;
        }
        local_a9 = 0;
        for (local_aa = 1; local_aa != 0x11; local_aa = local_aa + 1) {
          if (labelRegContent[local_aa] == branchRegContent[_unit.word._4_4_]) {
            local_a9 = local_aa;
            break;
          }
        }
        if (local_a9 != 0) {
          local_68[local_a9] = (RegNum)_unit.word._4_4_;
        }
      }
      _unit.word._4_4_ =
           BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&labelLifetime);
    }
  } while( true );
}

Assistant:

void LinearScan::AvoidCompensationConflicts(IR::LabelInstr *labelInstr, IR::BranchInstr *branchInstr,
                                            Lifetime *labelRegContent[], Lifetime *branchRegContent[],
                                            IR::Instr **pInsertionInstr, IR::Instr **pInsertionStartInstr, bool needsAirlock, bool *pHasAirlock)
{
    bool changed = true;

    // Look for conflicts in the incoming compensation code:
    //      MOV     ESI, EAX
    //      MOV     ECX, ESI    <<  ESI was lost...
    // Using XCHG:
    //      XCHG    ESI, EAX
    //      MOV     ECX, EAX
    //
    // Note that we need to iterate while(changed) to catch all conflicts
    while(changed) {
        RegNum conflictRegs[RegNumCount] = {RegNOREG};
        changed = false;

        FOREACH_BITSET_IN_UNITBV(reg, this->secondChanceRegs, BitVector)
        {
            Lifetime *labelLifetime = labelRegContent[reg];
            Lifetime *lifetime = branchRegContent[reg];

            // We don't have an XCHG for SSE2 regs
            if (lifetime == labelLifetime || IRType_IsFloat(RegTypes[reg]))
            {
                continue;
            }

            if (this->NeedsLoopBackEdgeCompensation(lifetime, labelInstr))
            {
                // Mismatch, we need to insert compensation code
                *pInsertionInstr = this->EnsureAirlock(needsAirlock, pHasAirlock, *pInsertionInstr, pInsertionStartInstr, branchInstr, labelInstr);

                if (conflictRegs[reg] != RegNOREG)
                {
                    // Eliminate conflict with an XCHG
                    IR::RegOpnd *reg1 = IR::RegOpnd::New(branchRegContent[reg]->sym, (RegNum)reg, RegTypes[reg], this->func);
                    IR::RegOpnd *reg2 = IR::RegOpnd::New(branchRegContent[reg]->sym, conflictRegs[reg], RegTypes[reg], this->func);
                    IR::Instr *instrXchg = IR::Instr::New(Js::OpCode::XCHG, reg1, reg1, reg2, this->func);
                    (*pInsertionInstr)->InsertBefore(instrXchg);
                    instrXchg->CopyNumber(*pInsertionInstr);

                    Lifetime *tmpLifetime = branchRegContent[reg];
                    branchRegContent[reg] = branchRegContent[conflictRegs[reg]];
                    branchRegContent[conflictRegs[reg]] = tmpLifetime;
                    reg = conflictRegs[reg];

                    changed = true;
                }
                RegNum labelReg = RegNOREG;
                FOREACH_INT_REG(regIter)
                {
                    if (labelRegContent[regIter] == branchRegContent[reg])
                    {
                        labelReg = regIter;
                        break;
                    }
                } NEXT_INT_REG;

                if (labelReg != RegNOREG)
                {
                    conflictRegs[labelReg] = (RegNum)reg;
                }
            }
        } NEXT_BITSET_IN_UNITBV;
    }
}